

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_variableEqualByNameOnly_Test::TestBody(Equality_variableEqualByNameOnly_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertHelper local_70 [8];
  AssertHelper local_68 [8];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  VariablePtr v2;
  VariablePtr v1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"variable",(allocator<char> *)&v2);
  libcellml::Variable::create((string *)&v1);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"variable",(allocator<char> *)&gtest_ar_);
  libcellml::Variable::create((string *)&v2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  testing::internal::
  CmpHelperNE<std::shared_ptr<libcellml::Variable>,std::shared_ptr<libcellml::Variable>>
            ((internal *)&gtest_ar,"v1","v2",&v1,(shared_ptr<libcellml::Variable> *)&v2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(local_70,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)&gtest_ar,
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  gtest_ar_.success_ =
       (bool)libcellml::Entity::equals
                       ((shared_ptr *)
                        v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"v1->equals(v2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x24,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(local_68,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)&gtest_ar,
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  cVar1 = libcellml::Entity::equals
                    ((shared_ptr *)
                     v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = (bool)cVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&gtest_ar,&gtest_ar_.success_,"v2->equals(v1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x25,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(local_68,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, variableEqualByNameOnly)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create("variable");
    libcellml::VariablePtr v2 = libcellml::Variable::create("variable");

    EXPECT_NE(v1, v2);
    EXPECT_TRUE(v1->equals(v2));
    EXPECT_TRUE(v2->equals(v1));
}